

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PostEmscripten.cpp
# Opt level: O0

void __thiscall wasm::PostEmscripten::optimizeExceptions(PostEmscripten *this,Module *module)

{
  bool bVar1;
  bool bVar2;
  pointer F;
  reference this_00;
  type table;
  PassRunner *runner;
  OptimizeInvokes local_268;
  anon_class_1_0_00000001 local_149;
  function<void_(Info_&,_wasm::Function_*)> local_148;
  anon_class_1_0_00000001 local_121;
  function<bool_(const_Info_&)> local_120;
  anon_class_1_0_00000001 local_f9;
  function<bool_(const_Info_&)> local_f8;
  anon_class_1_0_00000001 local_c1;
  Func local_c0;
  undefined1 local_a0 [8];
  CallGraphPropertyAnalysis<Info> analyzer;
  undefined1 local_60 [8];
  FlatTable flatTable;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *imp;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range2;
  bool hasInvokes;
  Module *module_local;
  PostEmscripten *this_local;
  
  bVar2 = false;
  __end2 = std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::begin(&module->functions);
  imp = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
        std::
        vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
        ::end(&module->functions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                     *)&imp), bVar1) {
    flatTable._24_8_ =
         __gnu_cxx::
         __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
         ::operator*(&__end2);
    F = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                  ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                   flatTable._24_8_);
    bVar1 = anon_unknown_0::isInvoke(F);
    if (bVar1) {
      bVar2 = true;
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end2);
  }
  if ((bVar2) &&
     (bVar2 = std::
              vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
              ::empty(&module->tables), !bVar2)) {
    this_00 = std::
              vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
              ::operator[](&module->tables,0);
    table = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator*(this_00);
    TableUtils::FlatTable::FlatTable((FlatTable *)local_60,module,table);
    bVar2 = ((byte)flatTable.names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage & 1) != 0;
    if (bVar2) {
      std::
      function<void(wasm::Function*,wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::Info&)>
      ::
      function<wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::_lambda(wasm::Function*,wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::Info&)_1_,void>
                ((function<void(wasm::Function*,wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::Info&)>
                  *)&local_c0,&local_c1);
      wasm::ModuleUtils::CallGraphPropertyAnalysis<Info>::CallGraphPropertyAnalysis
                ((CallGraphPropertyAnalysis<Info> *)local_a0,module,&local_c0);
      std::function<void_(wasm::Function_*,_Info_&)>::~function(&local_c0);
      std::function<bool(wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::Info_const&)>::
      function<wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::_lambda(wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::Info_const&)_1_,void>
                ((function<bool(wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::Info_const&)>
                  *)&local_f8,&local_f9);
      std::function<bool(wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::Info_const&)>::
      function<wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::_lambda(wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::Info_const&)_2_,void>
                ((function<bool(wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::Info_const&)>
                  *)&local_120,&local_121);
      std::
      function<void(wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::Info&,wasm::Function*)>
      ::
      function<wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::_lambda(wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::Info&,wasm::Function*)_1_,void>
                ((function<void(wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::Info&,wasm::Function*)>
                  *)&local_148,&local_149);
      wasm::ModuleUtils::CallGraphPropertyAnalysis<Info>::propagateBack
                ((CallGraphPropertyAnalysis<Info> *)local_a0,&local_f8,&local_120,&local_148,
                 NonDirectCallsHaveProperty);
      std::function<void_(Info_&,_wasm::Function_*)>::~function(&local_148);
      std::function<bool_(const_Info_&)>::~function(&local_120);
      std::function<bool_(const_Info_&)>::~function(&local_f8);
      optimizeExceptions(wasm::Module*)::OptimizeInvokes::OptimizeInvokes(std::map<wasm::
      Function*,wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::Info,std::less<wasm::
      Function*>,std::allocator<std::pair<wasm::Function*const,wasm::PostEmscripten::
      optimizeExceptions(wasm::Module*)::Info>>>&,wasm::TableUtils::FlatTable__
                (&local_268,
                 (map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                  *)&analyzer,(FlatTable *)local_60);
      runner = Pass::getPassRunner(&this->super_Pass);
      WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>::run
                (&local_268.
                  super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                 ,runner,module);
      optimizeExceptions::OptimizeInvokes::~OptimizeInvokes(&local_268);
      wasm::ModuleUtils::CallGraphPropertyAnalysis<Info>::~CallGraphPropertyAnalysis
                ((CallGraphPropertyAnalysis<Info> *)local_a0);
    }
    analyzer.map._M_t._M_impl.super__Rb_tree_header._M_node_count._5_3_ = 0;
    analyzer.map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ = !bVar2;
    TableUtils::FlatTable::~FlatTable((FlatTable *)local_60);
  }
  return;
}

Assistant:

void optimizeExceptions(Module* module) {
    // First, check if this code even uses invokes.
    bool hasInvokes = false;
    for (auto& imp : module->functions) {
      if (isInvoke(imp.get())) {
        hasInvokes = true;
      }
    }
    if (!hasInvokes || module->tables.empty()) {
      return;
    }
    // Next, see if the Table is flat, which we need in order to see where
    // invokes go statically. (In dynamic linking, the table is not flat,
    // and we can't do this.)
    TableUtils::FlatTable flatTable(*module, *module->tables[0]);
    if (!flatTable.valid) {
      return;
    }
    // This code has exceptions. Find functions that definitely cannot throw,
    // and remove invokes to them.
    struct Info
      : public ModuleUtils::CallGraphPropertyAnalysis<Info>::FunctionInfo {
      bool canThrow = false;
    };
    ModuleUtils::CallGraphPropertyAnalysis<Info> analyzer(
      *module, [&](Function* func, Info& info) {
        if (func->imported()) {
          // Assume any import can throw. We may want to reduce this to just
          // longjmp/cxa_throw/etc.
          info.canThrow = true;
        }
      });

    // Assume a non-direct call might throw.
    analyzer.propagateBack(
      [](const Info& info) { return info.canThrow; },
      [](const Info& info) { return true; },
      [](Info& info, Function* reason) { info.canThrow = true; },
      analyzer.NonDirectCallsHaveProperty);

    // Apply the information.
    struct OptimizeInvokes : public WalkerPass<PostWalker<OptimizeInvokes>> {
      bool isFunctionParallel() override { return true; }

      std::unique_ptr<Pass> create() override {
        return std::make_unique<OptimizeInvokes>(map, flatTable);
      }

      std::map<Function*, Info>& map;
      TableUtils::FlatTable& flatTable;

      OptimizeInvokes(std::map<Function*, Info>& map,
                      TableUtils::FlatTable& flatTable)
        : map(map), flatTable(flatTable) {}

      void visitCall(Call* curr) {
        auto* target = getModule()->getFunction(curr->target);
        if (!isInvoke(target)) {
          return;
        }
        // The first operand is the function pointer index, which must be
        // constant if we are to optimize it statically.
        if (auto* index = curr->operands[0]->dynCast<Const>()) {
          size_t indexValue = index->value.geti32();
          if (indexValue >= flatTable.names.size()) {
            // UB can lead to indirect calls to invalid pointers.
            return;
          }
          auto actualTarget = flatTable.names[indexValue];
          if (actualTarget.isNull()) {
            // UB can lead to an indirect call of 0 or an index in which there
            // is no function name.
            return;
          }
          if (map[getModule()->getFunction(actualTarget)].canThrow) {
            return;
          }
          // This invoke cannot throw! Make it a direct call.
          curr->target = actualTarget;
          for (Index i = 0; i < curr->operands.size() - 1; i++) {
            curr->operands[i] = curr->operands[i + 1];
          }
          curr->operands.resize(curr->operands.size() - 1);
        }
      }
    };
    OptimizeInvokes(analyzer.map, flatTable).run(getPassRunner(), module);
  }